

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_CloseDoor(FParser *this)

{
  int tag;
  int iVar1;
  int iVar2;
  
  if (0 < this->t_argc) {
    tag = intvalue(this->t_argv);
    if (tag != 0) {
      iVar1 = 1;
      if (1 < this->t_argc) {
        iVar1 = intvalue(this->t_argv + 1);
      }
      iVar2 = 0x7f;
      if (iVar1 < 0x7f) {
        iVar2 = iVar1;
      }
      iVar1 = 1;
      if (1 < iVar2) {
        iVar1 = iVar2;
      }
      EV_DoDoor(doorClose,(line_t_conflict *)0x0,(AActor *)0x0,tag,(double)(iVar1 * 2),0,0,0,false,0
               );
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_CloseDoor(void)
{
	int speed;
	int sectag;
	
	if (CheckArgs(1))
	{
		// got sector tag
		sectag = intvalue(t_argv[0]);
		if (sectag==0) return;	// tag 0 not allowed
		
		// door speed
		if(t_argc > 1) speed = intvalue(t_argv[1]);
		else speed = 1;    // 1= normal speed
		
		EV_DoDoor(DDoor::doorClose, NULL, NULL, sectag, 2.*clamp(speed, 1, 127), 0, 0, 0);
	}
}